

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::InternalExtensionMergeFrom
          (ExtensionSet *this,int number,Extension *other_extension)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  int iVar4;
  RepeatedField<long> *this_00;
  RepeatedField<unsigned_int> *this_01;
  RepeatedField<unsigned_long> *this_02;
  RepeatedField<float> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<bool> *this_05;
  RepeatedField<int> *pRVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  RepeatedPtrField<google::protobuf::MessageLite> *pRVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  long *plVar9;
  undefined8 *in_RDX;
  long *in_RDI;
  bool is_new_1;
  Extension *extension_1;
  MessageLite *target;
  MessageLite *other_message;
  int i;
  RepeatedPtrField<google::protobuf::MessageLite> *other_repeated_message;
  bool is_new;
  Extension *extension;
  size_t n;
  size_t n_7;
  size_t n_1;
  size_t n_2;
  size_t n_3;
  size_t n_4;
  size_t n_5;
  size_t n_6;
  size_t n_8;
  size_t n_9;
  RepeatedPtrFieldBase *in_stack_fffffffffffff858;
  string *in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff868;
  FieldType type;
  int in_stack_fffffffffffff86c;
  ArenaImpl *in_stack_fffffffffffff870;
  _func_void_void_ptr *in_stack_fffffffffffff880;
  Extension **in_stack_fffffffffffff888;
  undefined4 in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff894;
  undefined8 in_stack_fffffffffffff898;
  ExtensionSet *in_stack_fffffffffffff8a0;
  RepeatedField<int> *in_stack_fffffffffffff8d8;
  RepeatedField<int> *in_stack_fffffffffffff8e0;
  FieldDescriptor *in_stack_fffffffffffff958;
  long lVar10;
  FieldDescriptor *in_stack_fffffffffffff960;
  float value;
  FieldType type_00;
  undefined8 in_stack_fffffffffffff968;
  ExtensionSet *in_stack_fffffffffffff970;
  undefined8 *local_550;
  string local_548 [32];
  Type *local_528;
  MessageLite *local_520;
  int local_514;
  undefined8 local_510;
  byte local_431;
  undefined8 *local_430;
  undefined8 *local_428;
  RepeatedField<int> *local_410;
  long local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  RepeatedField<int> *local_3b8;
  RepeatedField<int> *local_3b0;
  long local_3a8;
  long local_390;
  RepeatedField<int> *local_388;
  RepeatedField<int> *local_370;
  RepeatedField<int> *local_368;
  RepeatedField<int> *local_360;
  RepeatedField<int> *local_358;
  long local_350;
  long local_348;
  size_t local_340;
  byte local_331;
  long local_330;
  void *local_328;
  size_t local_320;
  byte local_311;
  RepeatedField<int> *local_310;
  void *local_308;
  long local_300;
  long local_2f8;
  long local_2e0;
  RepeatedField<long> *local_2d8;
  long local_2d0;
  long local_2c8;
  size_t local_2c0;
  byte local_2b1;
  long local_2b0;
  void *local_2a8;
  long local_2a0;
  long local_298;
  long local_280;
  RepeatedField<unsigned_int> *local_278;
  long local_270;
  long local_268;
  size_t local_260;
  byte local_251;
  long local_250;
  void *local_248;
  long local_240;
  long local_238;
  long local_220;
  RepeatedField<unsigned_long> *local_218;
  long local_210;
  long local_208;
  size_t local_200;
  byte local_1f1;
  long local_1f0;
  void *local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1c0;
  RepeatedField<float> *local_1b8;
  long local_1b0;
  long local_1a8;
  size_t local_1a0;
  byte local_191;
  long local_190;
  void *local_188;
  long local_180;
  long local_178;
  long local_160;
  RepeatedField<double> *local_158;
  long local_150;
  long local_148;
  size_t local_140;
  byte local_131;
  long local_130;
  void *local_128;
  long local_120;
  long local_118;
  long local_100;
  RepeatedField<bool> *local_f8;
  long local_f0;
  long local_e8;
  size_t local_e0;
  byte local_d1;
  long local_d0;
  void *local_c8;
  long local_c0;
  long local_b8;
  long local_a0;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  long local_90;
  long local_88;
  size_t local_80;
  byte local_71;
  long local_70;
  void *local_68;
  long local_60;
  long local_58;
  long local_40;
  RepeatedPtrField<google::protobuf::MessageLite> *local_38;
  long local_30;
  long local_28;
  size_t local_20;
  byte local_11;
  long local_10;
  void *local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffff898 >> 0x20);
  local_428 = in_RDX;
  if ((*(byte *)((long)in_RDX + 9) & 1) == 0) {
    if ((*(byte *)((long)in_RDX + 10) & 1) == 0) {
      CVar2 = anon_unknown_18::cpp_type('\0');
      type = (FieldType)((uint)in_stack_fffffffffffff868 >> 0x18);
      value = (float)((ulong)in_stack_fffffffffffff960 >> 0x20);
      type_00 = (FieldType)((ulong)in_stack_fffffffffffff968 >> 0x18);
      iVar3 = (int)((ulong)in_stack_fffffffffffff968 >> 0x20);
      switch((ExtensionSet *)(ulong)(CVar2 - CPPTYPE_INT32)) {
      case (ExtensionSet *)0x0:
        SetInt32(in_stack_fffffffffffff970,iVar3,type_00,(int32)value,in_stack_fffffffffffff958);
        break;
      case (ExtensionSet *)0x1:
        SetInt64(in_stack_fffffffffffff970,iVar3,type_00,(int64)in_stack_fffffffffffff960,
                 in_stack_fffffffffffff958);
        break;
      case (ExtensionSet *)0x2:
        SetUInt32(in_stack_fffffffffffff970,iVar3,type_00,(uint32)value,in_stack_fffffffffffff958);
        break;
      case (ExtensionSet *)0x3:
        SetUInt64(in_stack_fffffffffffff970,iVar3,type_00,(uint64)in_stack_fffffffffffff960,
                  in_stack_fffffffffffff958);
        break;
      case (ExtensionSet *)0x4:
        SetDouble(in_stack_fffffffffffff970,iVar3,type_00,(double)in_stack_fffffffffffff960,
                  in_stack_fffffffffffff958);
        break;
      case (ExtensionSet *)0x5:
        SetFloat(in_stack_fffffffffffff970,iVar3,type_00,value,in_stack_fffffffffffff958);
        break;
      case (ExtensionSet *)0x6:
        SetBool(in_stack_fffffffffffff970,iVar3,type_00,
                SUB81((ulong)in_stack_fffffffffffff968 >> 0x10,0),in_stack_fffffffffffff960);
        break;
      case (ExtensionSet *)0x7:
        SetEnum(in_stack_fffffffffffff970,iVar3,type_00,(int)value,in_stack_fffffffffffff958);
        break;
      case (ExtensionSet *)0x8:
        std::__cxx11::string::string(local_548,(string *)*local_428);
        SetString((ExtensionSet *)in_stack_fffffffffffff870,in_stack_fffffffffffff86c,type,
                  in_stack_fffffffffffff860,(FieldDescriptor *)in_stack_fffffffffffff858);
        std::__cxx11::string::~string(local_548);
        break;
      case (ExtensionSet *)0x9:
        bVar1 = MaybeNewExtension((ExtensionSet *)(ulong)(CVar2 - CPPTYPE_INT32),iVar4,
                                  (FieldDescriptor *)
                                  CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                  in_stack_fffffffffffff888);
        if (bVar1) {
          *(undefined1 *)(local_550 + 1) = *(undefined1 *)(local_428 + 1);
          *(byte *)((long)local_550 + 0xb) = *(byte *)((long)local_428 + 0xb) & 1;
          *(undefined1 *)((long)local_550 + 9) = 0;
          if ((*(byte *)((long)local_428 + 10) >> 4 & 1) == 0) {
            *(byte *)((long)local_550 + 10) = *(byte *)((long)local_550 + 10) & 0xf;
            uVar8 = (**(code **)(*(long *)*local_428 + 0x20))((long *)*local_428,*in_RDI);
            *local_550 = uVar8;
            (**(code **)(*(long *)*local_550 + 0x40))((long *)*local_550,*local_428);
          }
          else {
            *(byte *)((long)local_550 + 10) = *(byte *)((long)local_550 + 10) & 0xf | 0x10;
            uVar8 = (**(code **)(*(long *)*local_428 + 0x10))((long *)*local_428,*in_RDI);
            *local_550 = uVar8;
            (**(code **)(*(long *)*local_550 + 0x68))((long *)*local_550,*local_428);
          }
        }
        else if ((*(byte *)((long)local_428 + 10) >> 4 & 1) == 0) {
          if ((*(byte *)((long)local_550 + 10) >> 4 & 1) == 0) {
            (**(code **)(*(long *)*local_550 + 0x40))((long *)*local_550,*local_428);
          }
          else {
            plVar9 = (long *)(**(code **)(*(long *)*local_550 + 0x20))
                                       ((long *)*local_550,*local_428);
            (**(code **)(*plVar9 + 0x40))(plVar9,*local_428);
          }
        }
        else if ((*(byte *)((long)local_550 + 10) >> 4 & 1) == 0) {
          plVar9 = (long *)*local_550;
          uVar8 = (**(code **)(*(long *)*local_428 + 0x18))((long *)*local_428,*local_550);
          (**(code **)(*plVar9 + 0x40))(plVar9,uVar8);
        }
        else {
          (**(code **)(*(long *)*local_550 + 0x68))((long *)*local_550,*local_428);
        }
        *(byte *)((long)local_550 + 10) = *(byte *)((long)local_550 + 10) & 0xf0;
      }
    }
  }
  else {
    local_431 = MaybeNewExtension(in_stack_fffffffffffff8a0,iVar4,
                                  (FieldDescriptor *)
                                  CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                  in_stack_fffffffffffff888);
    if ((bool)local_431) {
      *(undefined1 *)(local_430 + 1) = *(undefined1 *)(local_428 + 1);
      *(byte *)((long)local_430 + 0xb) = *(byte *)((long)local_428 + 0xb) & 1;
      *(undefined1 *)((long)local_430 + 9) = 1;
    }
    CVar2 = anon_unknown_18::cpp_type('\0');
    switch(CVar2) {
    case CPPTYPE_INT32:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_408 = lVar10;
        local_3c0 = lVar10;
        local_3a8 = lVar10;
        local_390 = lVar10;
        if (lVar10 == 0) {
          pRVar5 = (RepeatedField<int> *)operator_new(0x10);
          RepeatedField<int>::RepeatedField(pRVar5);
          local_388 = pRVar5;
        }
        else {
          local_331 = 0;
          local_348 = lVar10;
          local_330 = lVar10;
          local_340 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_331 & 1) == 0) {
            local_328 = ArenaImpl::AllocateAlignedAndAddCleanup
                                  ((ArenaImpl *)
                                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                   (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_328 = Arena::AllocateAlignedTo<8ul>
                                  ((Arena *)in_stack_fffffffffffff860,
                                   (size_t)in_stack_fffffffffffff858);
          }
          local_350 = lVar10;
          local_388 = Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                      Construct<google::protobuf::Arena*>
                                (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_388;
      }
      RepeatedField<int>::MergeFrom(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_INT64:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_400 = lVar10;
        local_300 = lVar10;
        local_2f8 = lVar10;
        local_2e0 = lVar10;
        if (lVar10 == 0) {
          this_00 = (RepeatedField<long> *)operator_new(0x10);
          RepeatedField<long>::RepeatedField(this_00);
          local_2d8 = this_00;
        }
        else {
          local_2b1 = 0;
          local_2c8 = lVar10;
          local_2b0 = lVar10;
          local_2c0 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_2b1 & 1) == 0) {
            local_2a8 = ArenaImpl::AllocateAlignedAndAddCleanup
                                  ((ArenaImpl *)
                                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                   (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_2a8 = Arena::AllocateAlignedTo<8ul>
                                  ((Arena *)in_stack_fffffffffffff860,
                                   (size_t)in_stack_fffffffffffff858);
          }
          local_2d0 = lVar10;
          local_2d8 = Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
                      Construct<google::protobuf::Arena*>
                                (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_2d8;
      }
      RepeatedField<long>::MergeFrom
                ((RepeatedField<long> *)in_stack_fffffffffffff8e0,
                 (RepeatedField<long> *)in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_UINT32:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_3f8 = lVar10;
        local_2a0 = lVar10;
        local_298 = lVar10;
        local_280 = lVar10;
        if (lVar10 == 0) {
          this_01 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          RepeatedField<unsigned_int>::RepeatedField(this_01);
          local_278 = this_01;
        }
        else {
          local_251 = 0;
          local_268 = lVar10;
          local_250 = lVar10;
          local_260 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_251 & 1) == 0) {
            local_248 = ArenaImpl::AllocateAlignedAndAddCleanup
                                  ((ArenaImpl *)
                                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                   (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_248 = Arena::AllocateAlignedTo<8ul>
                                  ((Arena *)in_stack_fffffffffffff860,
                                   (size_t)in_stack_fffffffffffff858);
          }
          local_270 = lVar10;
          local_278 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                      Construct<google::protobuf::Arena*>
                                (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_278;
      }
      RepeatedField<unsigned_int>::MergeFrom
                ((RepeatedField<unsigned_int> *)in_stack_fffffffffffff8e0,
                 (RepeatedField<unsigned_int> *)in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_UINT64:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_3f0 = lVar10;
        local_240 = lVar10;
        local_238 = lVar10;
        local_220 = lVar10;
        if (lVar10 == 0) {
          this_02 = (RepeatedField<unsigned_long> *)operator_new(0x10);
          RepeatedField<unsigned_long>::RepeatedField(this_02);
          local_218 = this_02;
        }
        else {
          local_1f1 = 0;
          local_208 = lVar10;
          local_1f0 = lVar10;
          local_200 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_1f1 & 1) == 0) {
            local_1e8 = ArenaImpl::AllocateAlignedAndAddCleanup
                                  ((ArenaImpl *)
                                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                   (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_1e8 = Arena::AllocateAlignedTo<8ul>
                                  ((Arena *)in_stack_fffffffffffff860,
                                   (size_t)in_stack_fffffffffffff858);
          }
          local_210 = lVar10;
          local_218 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                      Construct<google::protobuf::Arena*>
                                (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_218;
      }
      RepeatedField<unsigned_long>::MergeFrom
                ((RepeatedField<unsigned_long> *)in_stack_fffffffffffff8e0,
                 (RepeatedField<unsigned_long> *)in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_DOUBLE:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_3e0 = lVar10;
        local_180 = lVar10;
        local_178 = lVar10;
        local_160 = lVar10;
        if (lVar10 == 0) {
          this_04 = (RepeatedField<double> *)operator_new(0x10);
          RepeatedField<double>::RepeatedField(this_04);
          local_158 = this_04;
        }
        else {
          local_131 = 0;
          local_148 = lVar10;
          local_130 = lVar10;
          local_140 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_131 & 1) == 0) {
            local_128 = ArenaImpl::AllocateAlignedAndAddCleanup
                                  ((ArenaImpl *)
                                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                   (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_128 = Arena::AllocateAlignedTo<8ul>
                                  ((Arena *)in_stack_fffffffffffff860,
                                   (size_t)in_stack_fffffffffffff858);
          }
          local_150 = lVar10;
          local_158 = Arena::InternalHelper<google::protobuf::RepeatedField<double>>::
                      Construct<google::protobuf::Arena*>
                                (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_158;
      }
      RepeatedField<double>::MergeFrom
                ((RepeatedField<double> *)in_stack_fffffffffffff8e0,
                 (RepeatedField<double> *)in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_FLOAT:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_3e8 = lVar10;
        local_1e0 = lVar10;
        local_1d8 = lVar10;
        local_1c0 = lVar10;
        if (lVar10 == 0) {
          this_03 = (RepeatedField<float> *)operator_new(0x10);
          RepeatedField<float>::RepeatedField(this_03);
          local_1b8 = this_03;
        }
        else {
          local_191 = 0;
          local_1a8 = lVar10;
          local_190 = lVar10;
          local_1a0 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_191 & 1) == 0) {
            local_188 = ArenaImpl::AllocateAlignedAndAddCleanup
                                  ((ArenaImpl *)
                                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                   (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_188 = Arena::AllocateAlignedTo<8ul>
                                  ((Arena *)in_stack_fffffffffffff860,
                                   (size_t)in_stack_fffffffffffff858);
          }
          local_1b0 = lVar10;
          local_1b8 = Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
                      Construct<google::protobuf::Arena*>
                                (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_1b8;
      }
      RepeatedField<float>::MergeFrom
                ((RepeatedField<float> *)in_stack_fffffffffffff8e0,
                 (RepeatedField<float> *)in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_BOOL:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_3d8 = lVar10;
        local_120 = lVar10;
        local_118 = lVar10;
        local_100 = lVar10;
        if (lVar10 == 0) {
          this_05 = (RepeatedField<bool> *)operator_new(0x10);
          RepeatedField<bool>::RepeatedField(this_05);
          local_f8 = this_05;
        }
        else {
          local_d1 = 0;
          local_e8 = lVar10;
          local_d0 = lVar10;
          local_e0 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_d1 & 1) == 0) {
            local_c8 = ArenaImpl::AllocateAlignedAndAddCleanup
                                 ((ArenaImpl *)
                                  CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                  (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_c8 = Arena::AllocateAlignedTo<8ul>
                                 ((Arena *)in_stack_fffffffffffff860,
                                  (size_t)in_stack_fffffffffffff858);
          }
          local_f0 = lVar10;
          local_f8 = Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
                     Construct<google::protobuf::Arena*>
                               (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_f8;
      }
      RepeatedField<bool>::MergeFrom
                ((RepeatedField<bool> *)in_stack_fffffffffffff8e0,
                 (RepeatedField<bool> *)in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_ENUM:
      if ((local_431 & 1) != 0) {
        pRVar5 = (RepeatedField<int> *)*in_RDI;
        local_410 = pRVar5;
        local_3b8 = pRVar5;
        local_3b0 = pRVar5;
        local_370 = pRVar5;
        if (pRVar5 == (RepeatedField<int> *)0x0) {
          pRVar5 = (RepeatedField<int> *)operator_new(0x10);
          RepeatedField<int>::RepeatedField(pRVar5);
          local_368 = pRVar5;
        }
        else {
          local_311 = 0;
          local_358 = pRVar5;
          local_310 = pRVar5;
          local_320 = AlignUpTo8(0x10);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_311 & 1) == 0) {
            local_308 = ArenaImpl::AllocateAlignedAndAddCleanup
                                  ((ArenaImpl *)
                                   CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                   (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
            in_stack_fffffffffffff8e0 = pRVar5;
          }
          else {
            local_308 = Arena::AllocateAlignedTo<8ul>
                                  ((Arena *)in_stack_fffffffffffff860,
                                   (size_t)in_stack_fffffffffffff858);
            in_stack_fffffffffffff8e0 = pRVar5;
          }
          local_360 = in_stack_fffffffffffff8e0;
          local_368 = Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                      Construct<google::protobuf::Arena*>
                                (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_368;
      }
      RepeatedField<int>::MergeFrom(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      break;
    case CPPTYPE_STRING:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_3d0 = lVar10;
        local_c0 = lVar10;
        local_b8 = lVar10;
        local_a0 = lVar10;
        if (lVar10 == 0) {
          pRVar6 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x18);
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x4ad100);
          local_98 = pRVar6;
        }
        else {
          local_71 = 0;
          local_88 = lVar10;
          local_70 = lVar10;
          local_80 = AlignUpTo8(0x18);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_71 & 1) == 0) {
            local_68 = ArenaImpl::AllocateAlignedAndAddCleanup
                                 ((ArenaImpl *)
                                  CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                  (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_68 = Arena::AllocateAlignedTo<8ul>
                                 ((Arena *)in_stack_fffffffffffff860,
                                  (size_t)in_stack_fffffffffffff858);
          }
          local_90 = lVar10;
          local_98 = Arena::InternalHelper<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                     ::Construct<google::protobuf::Arena*>
                               (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_98;
      }
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::MergeFrom((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff860,
                  (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff858);
      break;
    case CPPTYPE_MESSAGE:
      if ((local_431 & 1) != 0) {
        lVar10 = *in_RDI;
        local_3c8 = lVar10;
        local_60 = lVar10;
        local_58 = lVar10;
        local_40 = lVar10;
        if (lVar10 == 0) {
          pRVar7 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
          RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                    ((RepeatedPtrField<google::protobuf::MessageLite> *)0x4ad2ce);
          local_38 = pRVar7;
        }
        else {
          local_11 = 0;
          local_28 = lVar10;
          local_10 = lVar10;
          local_20 = AlignUpTo8(0x18);
          ArenaImpl::RecordAlloc
                    (in_stack_fffffffffffff870,
                     (type_info *)CONCAT44(in_stack_fffffffffffff86c,in_stack_fffffffffffff868),
                     (size_t)in_stack_fffffffffffff860);
          if ((local_11 & 1) == 0) {
            local_8 = ArenaImpl::AllocateAlignedAndAddCleanup
                                ((ArenaImpl *)
                                 CONCAT44(in_stack_fffffffffffff894,in_stack_fffffffffffff890),
                                 (size_t)in_stack_fffffffffffff888,in_stack_fffffffffffff880);
          }
          else {
            local_8 = Arena::AllocateAlignedTo<8ul>
                                ((Arena *)in_stack_fffffffffffff860,
                                 (size_t)in_stack_fffffffffffff858);
          }
          local_30 = lVar10;
          local_38 = Arena::
                     InternalHelper<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                     ::Construct<google::protobuf::Arena*>
                               (in_stack_fffffffffffff860,&in_stack_fffffffffffff858->arena_);
        }
        *local_430 = local_38;
      }
      local_510 = *local_428;
      for (local_514 = 0; iVar4 = local_514,
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((RepeatedPtrField<google::protobuf::MessageLite> *)0x4ad436),
          iVar4 < iVar3; local_514 = local_514 + 1) {
        local_520 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                              ((RepeatedPtrField<google::protobuf::MessageLite> *)
                               in_stack_fffffffffffff860,
                               (int)((ulong)in_stack_fffffffffffff858 >> 0x20));
        local_528 = RepeatedPtrFieldBase::
                    AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                              (in_stack_fffffffffffff858);
        if (local_528 == (Type *)0x0) {
          iVar4 = (*local_520->_vptr_MessageLite[4])(local_520,*in_RDI);
          local_528 = (Type *)CONCAT44(extraout_var,iVar4);
          RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
                    ((RepeatedPtrField<google::protobuf::MessageLite> *)in_stack_fffffffffffff860,
                     (MessageLite *)in_stack_fffffffffffff858);
        }
        (*local_528->_vptr_MessageLite[8])(local_528,local_520);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::InternalExtensionMergeFrom(
    int number, const Extension& other_extension) {
  if (other_extension.is_repeated) {
    Extension* extension;
    bool is_new =
        MaybeNewExtension(number, other_extension.descriptor, &extension);
    if (is_new) {
      // Extension did not already exist in set.
      extension->type = other_extension.type;
      extension->is_packed = other_extension.is_packed;
      extension->is_repeated = true;
    } else {
      GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
      GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
      GOOGLE_DCHECK(extension->is_repeated);
    }

    switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE) \
  case WireFormatLite::CPPTYPE_##UPPERCASE:              \
    if (is_new) {                                        \
      extension->repeated_##LOWERCASE##_value =          \
          Arena::CreateMessage<REPEATED_TYPE>(arena_);   \
    }                                                    \
    extension->repeated_##LOWERCASE##_value->MergeFrom(  \
        *other_extension.repeated_##LOWERCASE##_value);  \
    break;

      HANDLE_TYPE(INT32, int32, RepeatedField<int32>);
      HANDLE_TYPE(INT64, int64, RepeatedField<int64>);
      HANDLE_TYPE(UINT32, uint32, RepeatedField<uint32>);
      HANDLE_TYPE(UINT64, uint64, RepeatedField<uint64>);
      HANDLE_TYPE(FLOAT, float, RepeatedField<float>);
      HANDLE_TYPE(DOUBLE, double, RepeatedField<double>);
      HANDLE_TYPE(BOOL, bool, RepeatedField<bool>);
      HANDLE_TYPE(ENUM, enum, RepeatedField<int>);
      HANDLE_TYPE(STRING, string, RepeatedPtrField<std::string>);
#undef HANDLE_TYPE

      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_new) {
          extension->repeated_message_value =
              Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        }
        // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
        // it would attempt to allocate new objects.
        RepeatedPtrField<MessageLite>* other_repeated_message =
            other_extension.repeated_message_value;
        for (int i = 0; i < other_repeated_message->size(); i++) {
          const MessageLite& other_message = other_repeated_message->Get(i);
          MessageLite* target =
              reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                  extension->repeated_message_value)
                  ->AddFromCleared<GenericTypeHandler<MessageLite>>();
          if (target == NULL) {
            target = other_message.New(arena_);
            extension->repeated_message_value->AddAllocated(target);
          }
          target->CheckTypeAndMergeFrom(other_message);
        }
        break;
    }
  } else {
    if (!other_extension.is_cleared) {
      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)  \
  case WireFormatLite::CPPTYPE_##UPPERCASE:           \
    Set##CAMELCASE(number, other_extension.type,      \
                   other_extension.LOWERCASE##_value, \
                   other_extension.descriptor);       \
    break;

        HANDLE_TYPE(INT32, int32, Int32);
        HANDLE_TYPE(INT64, int64, Int64);
        HANDLE_TYPE(UINT32, uint32, UInt32);
        HANDLE_TYPE(UINT64, uint64, UInt64);
        HANDLE_TYPE(FLOAT, float, Float);
        HANDLE_TYPE(DOUBLE, double, Double);
        HANDLE_TYPE(BOOL, bool, Bool);
        HANDLE_TYPE(ENUM, enum, Enum);
#undef HANDLE_TYPE
        case WireFormatLite::CPPTYPE_STRING:
          SetString(number, other_extension.type, *other_extension.string_value,
                    other_extension.descriptor);
          break;
        case WireFormatLite::CPPTYPE_MESSAGE: {
          Extension* extension;
          bool is_new =
              MaybeNewExtension(number, other_extension.descriptor, &extension);
          if (is_new) {
            extension->type = other_extension.type;
            extension->is_packed = other_extension.is_packed;
            extension->is_repeated = false;
            if (other_extension.is_lazy) {
              extension->is_lazy = true;
              extension->lazymessage_value =
                  other_extension.lazymessage_value->New(arena_);
              extension->lazymessage_value->MergeFrom(
                  *other_extension.lazymessage_value);
            } else {
              extension->is_lazy = false;
              extension->message_value =
                  other_extension.message_value->New(arena_);
              extension->message_value->CheckTypeAndMergeFrom(
                  *other_extension.message_value);
            }
          } else {
            GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
            GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
            GOOGLE_DCHECK(!extension->is_repeated);
            if (other_extension.is_lazy) {
              if (extension->is_lazy) {
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    other_extension.lazymessage_value->GetMessage(
                        *extension->message_value));
              }
            } else {
              if (extension->is_lazy) {
                extension->lazymessage_value
                    ->MutableMessage(*other_extension.message_value)
                    ->CheckTypeAndMergeFrom(*other_extension.message_value);
              } else {
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            }
          }
          extension->is_cleared = false;
          break;
        }
      }
    }
  }
}